

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.h
# Opt level: O2

void __thiscall cmDefinitions::Def::Def(Def *this,char *v)

{
  char *__s;
  allocator<char> local_11;
  
  __s = "";
  if (v != (char *)0x0) {
    __s = v;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)this,__s,&local_11);
  this->Exists = v != (char *)0x0;
  this->Used = false;
  return;
}

Assistant:

Def(const char* v)
      : std_string(v ? v : "")
      , Exists(v ? true : false)
    {
    }